

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# value-types.cc
# Opt level: O2

matrix4d * __thiscall tinyusdz::value::matrix4d::operator=(matrix4d *this,matrix4f *src)

{
  matrix4d *pmVar1;
  size_t j;
  long lVar2;
  long lVar3;
  
  pmVar1 = this;
  for (lVar2 = 0; lVar2 != 4; lVar2 = lVar2 + 1) {
    for (lVar3 = 0; lVar3 != 4; lVar3 = lVar3 + 1) {
      (*(double (*) [4])*(double (*) [4])this)[lVar3] =
           (double)(*(float (*) [4])*(float (*) [4])src)[lVar3];
    }
    this = (matrix4d *)((long)this + 0x20);
    src = (matrix4f *)((long)src + 0x10);
  }
  return pmVar1;
}

Assistant:

matrix4d &matrix4d::operator=(const matrix4f &src) {

  for (size_t j = 0; j < 4; j++) {
    for (size_t i = 0; i < 4; i++) {
      m[j][i] = double(src.m[j][i]);
    }
  }

  return *this;
}